

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O2

void __thiscall libebml::MemIOCallback::~MemIOCallback(MemIOCallback *this)

{
  ~MemIOCallback(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

MemIOCallback::~MemIOCallback()
{
  if (dataBuffer != NULL)
    free(dataBuffer);
}